

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O3

void __thiscall ParamIDAnalysis::saveXml(ParamIDAnalysis *this,ostream *s,bool moredetail)

{
  Funcdata *pFVar1;
  AddrSpace *pAVar2;
  ProtoModel *pPVar3;
  ParamIDAnalysis *pPVar4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  char local_c9;
  ParamIDAnalysis *local_c8;
  char *local_c0;
  long local_b8;
  char local_b0 [16];
  ostream *local_a0;
  _List_node_base *local_98;
  char *local_90 [2];
  char local_80 [16];
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<parammeasures",0xe);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
  pFVar1 = this->fd;
  local_90[0] = (char *)CONCAT71(local_90[0]._1_7_,0x20);
  local_c8 = this;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_90,1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c0,local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
  xml_escape(s,(pFVar1->name)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n  ",4);
  pFVar1 = local_c8->fd;
  std::__ostream_insert<char,std::char_traits<char>>(s,"<addr",5);
  pAVar2 = (pFVar1->baseaddr).base;
  if (pAVar2 != (AddrSpace *)0x0) {
    (*pAVar2->_vptr_AddrSpace[7])(pAVar2,s,(pFVar1->baseaddr).offset);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\n  <proto",9);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"model","");
  pPVar3 = (local_c8->fd->funcp).model;
  local_90[0] = (char *)CONCAT71(local_90[0]._1_7_,0x20);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_90,1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c0,local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
  xml_escape(s,(pPVar3->name)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  pPVar4 = local_c8;
  if ((local_c8->fd->funcp).extrapop == 0x8000) {
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"extrapop","");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"unknown","");
    local_c9 = ' ';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_c9,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c0,local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
    xml_escape(s,local_90[0]);
    std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  else {
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"extrapop","");
    local_90[0] = (char *)CONCAT71(local_90[0]._1_7_,0x20);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_90,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c0,local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  local_a0 = s;
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>\n",3);
  poVar5 = local_a0;
  local_98 = (_List_node_base *)&pPVar4->InputParamMeasures;
  p_Var6 = (pPVar4->InputParamMeasures).
           super__List_base<ParamMeasure,_std::allocator<ParamMeasure>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var6 != local_98) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"input","");
      ParamMeasure::saveXml((ParamMeasure *)(p_Var6 + 1),poVar5,&local_50,moredetail);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != local_98);
  }
  poVar5 = local_a0;
  p_Var6 = (local_c8->OutputParamMeasures).
           super__List_base<ParamMeasure,_std::allocator<ParamMeasure>_>._M_impl._M_node.
           super__List_node_base._M_next;
  local_c8 = (ParamIDAnalysis *)&local_c8->OutputParamMeasures;
  if ((ParamIDAnalysis *)p_Var6 != local_c8) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"output","");
      ParamMeasure::saveXml((ParamMeasure *)(p_Var6 + 1),poVar5,&local_70,moredetail);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      p_Var6 = p_Var6->_M_next;
    } while ((ParamIDAnalysis *)p_Var6 != local_c8);
  }
  poVar5 = local_a0;
  std::__ostream_insert<char,std::char_traits<char>>(local_a0,"</parammeasures>",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  return;
}

Assistant:

void ParamIDAnalysis::saveXml( ostream &s,bool moredetail ) const

{
  s << "<parammeasures";
  a_v( s, "name", fd->getName() );
  s << ">\n  ";
  fd->getAddress().saveXml( s );
  s << "\n  <proto";

  a_v(s,"model", fd->getFuncProto().getModelName());
  int4 extrapop = fd->getFuncProto().getExtraPop();
  if (extrapop == ProtoModel::extrapop_unknown)
    a_v(s,"extrapop","unknown");
  else
    a_v_i(s,"extrapop",extrapop);
  s << "/>\n";
  list<ParamMeasure>::const_iterator pm_iter;
  for( pm_iter = InputParamMeasures.begin(); pm_iter != InputParamMeasures.end(); ++pm_iter) {
    const ParamMeasure &pm( *pm_iter );
    s << "  ";
    pm.saveXml(s,"input",moredetail);
  }
  for( pm_iter = OutputParamMeasures.begin(); pm_iter != OutputParamMeasures.end() ; ++pm_iter) {
    const ParamMeasure &pm( *pm_iter );
    s << "  ";
    pm.saveXml( s, "output", moredetail );
  }
  s << "</parammeasures>";
  s << "\n";
}